

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::prim::AxisEnumHandler
            (expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *tok)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  int iVar4;
  undefined4 *puVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  pointer pbVar10;
  long lVar11;
  ulong uVar12;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_290;
  undefined1 local_288 [24];
  long lStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  ulong local_258;
  long lStack_250;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  long *local_228 [2];
  long local_218 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined2 *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined6 uStack_1b6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  char local_188;
  ios_base local_138 [264];
  
  puVar5 = (undefined4 *)operator_new(0x30);
  *puVar5 = 0;
  *(char **)(puVar5 + 2) = "X";
  puVar5[4] = 1;
  *(char **)(puVar5 + 6) = "Y";
  puVar5[8] = 2;
  *(char **)(puVar5 + 10) = "Z";
  local_228[0] = local_218;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"axis","");
  iVar4 = ::std::__cxx11::string::compare((char *)tok);
  if (iVar4 != 0) {
    lVar11 = 0;
LAB_0021286c:
    lVar11 = lVar11 + 0x10;
    if (lVar11 != 0x30) goto code_r0x00212876;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar11 = 8;
    local_290 = __return_storage_ptr__;
    do {
      ::std::__cxx11::string::string
                ((string *)&local_1a8,*(char **)((long)puVar5 + lVar11),(allocator *)&local_2b0);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                 &local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x38);
    local_2e0._M_allocated_capacity._0_3_ = 0x202c;
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    local_2d0.field_2._M_allocated_capacity._0_2_ = 0x22;
    local_2d0._M_string_length = 1;
    quote((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_288,&local_1e8,&local_2d0);
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    if (local_288._0_8_ != local_288._8_8_) {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,((_Alloc_hider *)local_288._0_8_)->_M_p,
                 *(size_type *)(local_288._0_8_ + 8));
      local_288._0_8_ = local_288._0_8_ + 0x20;
      if (local_288._0_8_ != local_288._8_8_) {
        do {
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1a8,local_2e0._M_local_buf,2);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,(((pointer)local_288._0_8_)->_M_dataplus)._M_p,
                     ((pointer)local_288._0_8_)->_M_string_length);
          local_288._0_8_ = local_288._0_8_ + 0x20;
        } while (local_288._0_8_ != local_288._8_8_);
      }
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    ::std::ios_base::~ios_base(local_138);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_1a8.field_2;
    ::std::operator+(&local_208,"Allowed tokens are [",&local_2b0);
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_208);
    local_268._M_allocated_capacity = (size_type)&local_258;
    puVar9 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar9) {
      local_258 = *puVar9;
      lStack_250 = plVar8[3];
    }
    else {
      local_258 = *puVar9;
      local_268._M_allocated_capacity = (size_type)(ulong *)*plVar8;
    }
    local_268._8_8_ = plVar8[1];
    *plVar8 = (long)puVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    local_1b8 = 0x22;
    local_1c0 = 1;
    local_1a8.field_2._M_allocated_capacity._0_2_ = 0x22;
    local_1a8._M_string_length = 1;
    local_1c8 = &local_1b8;
    local_1a8._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)(tok->_M_dataplus)._M_p);
    plVar8 = (long *)::std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_1c8);
    puVar9 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar9) {
      local_238 = *puVar9;
      lStack_230 = plVar8[3];
      local_248 = &local_238;
    }
    else {
      local_238 = *puVar9;
      local_248 = (ulong *)*plVar8;
    }
    local_240 = plVar8[1];
    *plVar8 = (long)puVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    uVar12 = 0xf;
    if ((ulong *)local_268._M_allocated_capacity != &local_258) {
      uVar12 = local_258;
    }
    if (uVar12 < (ulong)(local_240 + local_268._8_8_)) {
      uVar12 = 0xf;
      if (local_248 != &local_238) {
        uVar12 = local_238;
      }
      if (uVar12 < (ulong)(local_240 + local_268._8_8_)) goto LAB_00212be2;
      plVar8 = (long *)::std::__cxx11::string::replace
                                 ((ulong)&local_248,0,(char *)0x0,local_268._M_allocated_capacity);
    }
    else {
LAB_00212be2:
      plVar8 = (long *)::std::__cxx11::string::_M_append(local_268._M_local_buf,(ulong)local_248);
    }
    local_288._0_8_ = local_288 + 0x10;
    pbVar10 = (pointer)(plVar8 + 2);
    if ((pointer)*plVar8 == pbVar10) {
      local_288._16_8_ = (pbVar10->_M_dataplus)._M_p;
      lStack_270 = plVar8[3];
    }
    else {
      local_288._16_8_ = (pbVar10->_M_dataplus)._M_p;
      local_288._0_8_ = (pointer)*plVar8;
    }
    local_288._8_8_ = plVar8[1];
    *plVar8 = (long)pbVar10;
    plVar8[1] = 0;
    *(undefined1 *)&(pbVar10->_M_dataplus)._M_p = 0;
    puVar7 = (undefined8 *)::std::__cxx11::string::append(local_288);
    paVar1 = &local_2d0.field_2;
    puVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_2d0.field_2._M_allocated_capacity = *puVar9;
      local_2d0.field_2._8_8_ = puVar7[3];
      local_2d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *puVar9;
      local_2d0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_1a8.field_2._M_allocated_capacity = local_2d0.field_2._M_allocated_capacity;
    local_1a8._M_string_length = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == paVar1) {
      local_2e0._8_8_ = local_2d0.field_2._8_8_;
      local_2f0 = &local_2e0;
    }
    else {
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p;
    }
    local_2d0._M_string_length = 0;
    local_2d0.field_2._M_allocated_capacity =
         local_2d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_188 = '\0';
    if (local_2f0 == &local_2e0) {
      local_1a8.field_2._8_8_ = local_2e0._8_8_;
      local_1a8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1a8._M_dataplus._M_p = (pointer)local_2f0;
    }
    local_2e0._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_2d0._M_dataplus._M_p = (pointer)paVar1;
    if ((pointer)local_288._0_8_ != (pointer)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_288._16_8_)->_M_p + 1));
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    __return_storage_ptr__ = local_290;
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,CONCAT62(uStack_1b6,local_1b8) + 1);
    }
    if ((ulong *)local_268._M_allocated_capacity != &local_258) {
      operator_delete((void *)local_268._M_allocated_capacity,local_258 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT62(local_208.field_2._M_allocated_capacity._2_6_,
                               local_208.field_2._M_allocated_capacity._0_2_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
    goto LAB_00212e1d;
  }
LAB_0021288a:
  local_188 = '\x01';
  local_1a8._M_dataplus._M_p._0_1_ = 1;
LAB_00212e1d:
  if (local_188 == '\x01') {
    lVar11 = 8;
    do {
      iVar4 = ::std::__cxx11::string::compare((char *)tok);
      if (iVar4 == 0) {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value = *(value_type *)((long)puVar5 + lVar11 + -8);
        goto LAB_002131b1;
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x38);
    paVar1 = &local_208.field_2;
    local_208.field_2._M_allocated_capacity._0_2_ = 0x22;
    local_208._M_string_length = 1;
    paVar2 = &local_2b0.field_2;
    local_2b0._M_dataplus._M_p = (pointer)paVar2;
    local_290 = __return_storage_ptr__;
    local_208._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,paVar1,(undefined1 *)((long)&local_208.field_2 + 1));
    ::std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)(tok->_M_dataplus)._M_p);
    plVar8 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_2b0,(ulong)local_208._M_dataplus._M_p);
    puVar9 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar9) {
      local_258 = *puVar9;
      lStack_250 = plVar8[3];
      local_268._M_allocated_capacity = (size_type)&local_258;
    }
    else {
      local_258 = *puVar9;
      local_268._M_allocated_capacity = (size_type)(ulong *)*plVar8;
    }
    local_268._8_8_ = plVar8[1];
    *plVar8 = (long)puVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    plVar8 = (long *)::std::__cxx11::string::append(local_268._M_local_buf);
    pbVar10 = (pointer)(plVar8 + 2);
    if ((pointer)*plVar8 == pbVar10) {
      local_288._16_8_ = (pbVar10->_M_dataplus)._M_p;
      lStack_270 = plVar8[3];
      local_288._0_8_ = (pointer)(local_288 + 0x10);
    }
    else {
      local_288._16_8_ = (pbVar10->_M_dataplus)._M_p;
      local_288._0_8_ = (pointer)*plVar8;
    }
    local_288._8_8_ = plVar8[1];
    *plVar8 = (long)pbVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::_M_append(local_288,(ulong)local_228[0]);
    puVar9 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_2d0.field_2._M_allocated_capacity = *puVar9;
      local_2d0.field_2._8_8_ = plVar8[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *puVar9;
      local_2d0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_2d0._M_string_length = plVar8[1];
    *plVar8 = (long)puVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::append((char *)&local_2d0);
    puVar9 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_2e0._M_allocated_capacity = *puVar9;
      local_2e0._8_8_ = plVar8[3];
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0._M_allocated_capacity = *puVar9;
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8;
    }
    local_2b0.field_2._M_allocated_capacity = local_2e0._M_allocated_capacity;
    sVar3 = plVar8[1];
    *plVar8 = (long)puVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if (local_2f0 == &local_2e0) {
      local_2b0.field_2._8_8_ = local_2e0._8_8_;
      local_2b0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_2b0._M_dataplus._M_p = (pointer)local_2f0;
    }
    local_2e0._M_allocated_capacity = local_2e0._M_allocated_capacity & 0xffffffffffffff00;
    (local_290->contained).
    super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    puVar9 = (ulong *)((long)&(local_290->contained).
                              super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0 + 0x10);
    *(ulong **)
     &(local_290->contained).
      super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = puVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar2) {
      *puVar9 = local_2b0.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(local_290->contained).
               super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = local_2b0.field_2._8_8_;
    }
    else {
      (local_290->contained).
      super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = local_2b0._M_dataplus._M_p;
      *(size_type *)
       ((long)&(local_290->contained).
               super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = local_2b0.field_2._M_allocated_capacity;
    }
    (local_290->contained).
    super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = sVar3;
    local_2b0._M_string_length = 0;
    local_2b0.field_2._M_allocated_capacity =
         local_2b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_2b0._M_dataplus._M_p = (pointer)paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_288._0_8_ != (pointer)(local_288 + 0x10)) {
      operator_delete((void *)local_288._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_288._16_8_)->_M_p + 1));
    }
    if ((ulong *)local_268._M_allocated_capacity != &local_258) {
      operator_delete((void *)local_268._M_allocated_capacity,local_258 + 1);
    }
    __return_storage_ptr__ = local_290;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT62(local_208.field_2._M_allocated_capacity._2_6_,
                               local_208.field_2._M_allocated_capacity._0_2_) + 1);
      __return_storage_ptr__ = local_290;
    }
  }
  else {
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,local_1a8._M_dataplus._M_p,
               local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    puVar9 = (ulong *)((long)&(__return_storage_ptr__->contained).
                              super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0 + 0x10);
    *(ulong **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = puVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == &local_2b0.field_2) {
      *puVar9 = local_2b0.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = local_2b0.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = local_2b0._M_dataplus._M_p;
      *(size_type *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = local_2b0.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = local_2b0._M_string_length;
  }
LAB_002131b1:
  if ((local_188 == '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2)) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  operator_delete(puVar5,0x30);
  return __return_storage_ptr__;
code_r0x00212876:
  iVar4 = ::std::__cxx11::string::compare((char *)tok);
  if (iVar4 == 0) goto LAB_0021288a;
  goto LAB_0021286c;
}

Assistant:

static nonstd::expected<Axis, std::string> AxisEnumHandler(const std::string &tok) {
  using EnumTy = std::pair<Axis, const char *>;
  const std::vector<EnumTy> enums = {
      std::make_pair(Axis::X, "X"),
      std::make_pair(Axis::Y,
                     "Y"),
      std::make_pair(Axis::Z, "Z"),
  };
  return EnumHandler<Axis>("axis", tok, enums);
}